

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O0

int __thiscall QHeaderView::sectionViewportPosition(QHeaderView *this,int logicalIndex)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QHeaderViewPrivate *pQVar4;
  int in_ESI;
  int offsetPosition;
  int position;
  QHeaderViewPrivate *d;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  pQVar4 = d_func((QHeaderView *)0x836210);
  iVar2 = count((QHeaderView *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (in_ESI < iVar2) {
    iVar2 = sectionPosition((QHeaderView *)
                            CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_ESI);
    local_4 = iVar2;
    if (-1 < iVar2) {
      local_4 = iVar2 - pQVar4->headerOffset;
      bVar1 = QHeaderViewPrivate::reverse
                        ((QHeaderViewPrivate *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      if (bVar1) {
        iVar3 = QWidget::width((QWidget *)0x836295);
        iVar2 = sectionSize((QHeaderView *)CONCAT44(iVar2,local_4),in_ESI);
        local_4 = iVar3 - (local_4 + iVar2);
      }
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int QHeaderView::sectionViewportPosition(int logicalIndex) const
{
    Q_D(const QHeaderView);
    if (logicalIndex >= count())
        return -1;
    int position = sectionPosition(logicalIndex);
    if (position < 0)
        return position; // the section was hidden
    int offsetPosition = position - d->headerOffset;
    if (d->reverse())
        return d->viewport->width() - (offsetPosition + sectionSize(logicalIndex));
    return offsetPosition;
}